

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyMeshT.hh
# Opt level: O1

Scalar __thiscall
OpenMesh::
PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
::calc_dihedral_angle
          (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           *this,HalfedgeHandle _heh)

{
  bool bVar1;
  Scalar SVar2;
  double dVar3;
  double dVar4;
  Normal local_90;
  undefined1 local_78 [8];
  Normal n0;
  undefined1 local_40 [8];
  Normal n1;
  
  bVar1 = PolyConnectivity::is_boundary
                    ((PolyConnectivity *)this,(EdgeHandle)((int)_heh.super_BaseHandle.idx_ >> 1));
  SVar2 = 0.0;
  if (!bVar1) {
    calc_sector_normal(this,_heh,(Normal *)local_78);
    calc_sector_normal(this,(HalfedgeHandle)
                            ((-((uint)_heh.super_BaseHandle.idx_ & 1) | 1) +
                            (int)_heh.super_BaseHandle.idx_),(Normal *)local_40);
    calc_edge_vector(&local_90,this,_heh);
    n0.super_VectorDataT<double,_3>.values_[2] = local_90.super_VectorDataT<double,_3>.values_[2];
    dVar3 = n0.super_VectorDataT<double,_3>.values_[1] * n0.super_VectorDataT<double,_3>.values_[1]
            + (double)local_78 * (double)local_78 +
              n0.super_VectorDataT<double,_3>.values_[0] *
              n0.super_VectorDataT<double,_3>.values_[0];
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar4 = n1.super_VectorDataT<double,_3>.values_[1] * n1.super_VectorDataT<double,_3>.values_[1]
            + (double)local_40 * (double)local_40 +
              n1.super_VectorDataT<double,_3>.values_[0] *
              n1.super_VectorDataT<double,_3>.values_[0];
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar3 = dVar3 * dVar4;
    SVar2 = 0.0;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      SVar2 = angle<double>((n0.super_VectorDataT<double,_3>.values_[1] *
                             n1.super_VectorDataT<double,_3>.values_[1] +
                            n0.super_VectorDataT<double,_3>.values_[0] *
                            n1.super_VectorDataT<double,_3>.values_[0] +
                            (double)local_78 * (double)local_40 + 0.0) / dVar3,
                            (n0.super_VectorDataT<double,_3>.values_[0] *
                             n1.super_VectorDataT<double,_3>.values_[1] -
                            n1.super_VectorDataT<double,_3>.values_[0] *
                            n0.super_VectorDataT<double,_3>.values_[1]) *
                            local_90.super_VectorDataT<double,_3>.values_[0] + 0.0 +
                            (n0.super_VectorDataT<double,_3>.values_[1] * (double)local_40 -
                            n1.super_VectorDataT<double,_3>.values_[1] * (double)local_78) *
                            local_90.super_VectorDataT<double,_3>.values_[1] +
                            ((double)local_78 * n1.super_VectorDataT<double,_3>.values_[0] -
                            (double)local_40 * n0.super_VectorDataT<double,_3>.values_[0]) *
                            n0.super_VectorDataT<double,_3>.values_[2]);
    }
  }
  return SVar2;
}

Assistant:

Scalar calc_dihedral_angle(HalfedgeHandle _heh) const
  {
    if (this->is_boundary(this->edge_handle(_heh)))
    {//the dihedral angle at a boundary edge is 0
      return 0;
    }
    Normal n0, n1, he;
    calc_sector_normal(_heh, n0);
    calc_sector_normal(this->opposite_halfedge_handle(_heh), n1);
    calc_edge_vector(_heh, he);
    Scalar denom = n0.norm()*n1.norm();
    if (denom == Scalar(0))
    {
      return 0;
    }
    Scalar da_cos = dot(n0, n1)/denom;
    //should be normalized, but we need only the sign
    Scalar da_sin_sign = dot(cross(n0, n1), he);
    return angle(da_cos, da_sin_sign);
  }